

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  uint uVar2;
  uint uVar3;
  BVH *bvh;
  NodeRef root;
  Scene *pSVar4;
  float *pfVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  size_t k;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined8 uVar19;
  undefined8 uVar20;
  uint uVar21;
  int iVar22;
  undefined4 uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  ulong uVar30;
  NodeRef *pNVar31;
  bool bVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar50;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar47;
  float fVar48;
  float fVar49;
  undefined1 in_ZMM0 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar72;
  float fVar73;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar70;
  float fVar71;
  undefined1 auVar69 [64];
  undefined1 extraout_var [48];
  undefined1 auVar74 [48];
  float fVar75;
  float fVar76;
  float fVar98;
  float fVar101;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar102;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar99;
  undefined1 auVar86 [16];
  float fVar100;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar121;
  float fVar122;
  undefined1 auVar106 [16];
  float fVar124;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar123;
  undefined1 auVar112 [16];
  float fVar125;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar139;
  float fVar152;
  float fVar153;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar154;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  float fVar176;
  float fVar177;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar179;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar178;
  float fVar180;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar181;
  float fVar182;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar200;
  float fVar201;
  float fVar211;
  undefined1 auVar202 [16];
  float fVar208;
  float fVar210;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar207;
  float fVar209;
  undefined1 auVar206 [64];
  float fVar212;
  float fVar218;
  float fVar219;
  undefined1 auVar213 [16];
  float fVar220;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  float fVar221;
  float fVar226;
  undefined1 auVar222 [16];
  float fVar224;
  float fVar225;
  undefined1 auVar223 [64];
  float fVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar230 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar234;
  undefined1 auVar235 [64];
  float fVar236;
  float fVar237;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar238 [16];
  Precalculations pre;
  undefined1 local_1a78 [8];
  float fStack_1a70;
  float fStack_1a6c;
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  undefined1 local_1a28 [16];
  undefined1 local_1a18 [16];
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  RTCHitN local_18f8 [16];
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  uint local_1888;
  uint uStack_1884;
  uint uStack_1880;
  uint uStack_187c;
  uint uStack_1878;
  uint uStack_1874;
  uint uStack_1870;
  uint uStack_186c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar9 = mm_lookupmask_ps._240_16_;
  uVar20 = mm_lookupmask_ps._8_8_;
  uVar19 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar45 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar46 = vpcmpeqd_avx(auVar45,(undefined1  [16])valid_i->field_0);
    auVar77 = ZEXT816(0) << 0x40;
    auVar68 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar77,5);
    auVar96 = auVar46 & auVar68;
    if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar96[0xf] < '\0')
    {
      auVar68 = vandps_avx(auVar68,auVar46);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar110._8_4_ = 0x7fffffff;
      auVar110._0_8_ = 0x7fffffff7fffffff;
      auVar110._12_4_ = 0x7fffffff;
      auVar46 = vandps_avx(auVar110,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar199._8_4_ = 0x219392ef;
      auVar199._0_8_ = 0x219392ef219392ef;
      auVar199._12_4_ = 0x219392ef;
      auVar96 = vcmpps_avx(auVar46,auVar199,1);
      auVar213._8_4_ = 0x3f800000;
      auVar213._0_8_ = &DAT_3f8000003f800000;
      auVar213._12_4_ = 0x3f800000;
      auVar155 = vdivps_avx(auVar213,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar46 = vandps_avx(auVar110,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar109 = vcmpps_avx(auVar46,auVar199,1);
      auVar156 = vdivps_avx(auVar213,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar46 = vandps_avx(auVar110,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar46 = vcmpps_avx(auVar46,auVar199,1);
      auVar193._8_4_ = 0x5d5e0b6b;
      auVar193._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar193._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar155,auVar193,auVar96)
      ;
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar156,auVar193,auVar109);
      auVar96 = vdivps_avx(auVar213,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar96,auVar193,auVar46);
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar77,1);
      auVar155._8_4_ = 0x10;
      auVar155._0_8_ = 0x1000000010;
      auVar155._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar46,auVar155);
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar77,5);
      auVar96._8_4_ = 0x20;
      auVar96._0_8_ = 0x2000000020;
      auVar96._12_4_ = 0x20;
      auVar156._8_4_ = 0x30;
      auVar156._0_8_ = 0x3000000030;
      auVar156._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar156,auVar96,auVar46)
      ;
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar77,5);
      auVar109._8_4_ = 0x40;
      auVar109._0_8_ = 0x4000000040;
      auVar109._12_4_ = 0x40;
      auVar157._8_4_ = 0x50;
      auVar157._0_8_ = 0x5000000050;
      auVar157._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar157,auVar109,auVar46);
      auVar46 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar77);
      auVar96 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar77);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar217 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar46,auVar68);
      auVar69 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar46._8_4_ = 0xff800000;
      auVar46._0_8_ = 0xff800000ff800000;
      auVar46._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar46,auVar96,auVar68);
      terminated.field_0.i[1] = auVar68._4_4_ ^ auVar45._4_4_;
      terminated.field_0.i[0] = auVar68._0_4_ ^ auVar45._0_4_;
      terminated.field_0.i[2] = auVar68._8_4_ ^ auVar45._8_4_;
      terminated.field_0.i[3] = auVar68._12_4_ ^ auVar45._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 3;
      }
      else {
        uVar28 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar31 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar29 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_003266b5:
      paVar29 = paVar29 + -1;
      root.ptr = pNVar31[-1].ptr;
      pNVar31 = pNVar31 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0032795d;
      aVar234 = *paVar29;
      auVar45 = vcmpps_avx((undefined1  [16])aVar234,(undefined1  [16])tray.tfar.field_0,1);
      uVar21 = vmovmskps_avx(auVar45);
      if (uVar21 == 0) {
LAB_0032796e:
        iVar22 = 2;
      }
      else {
        uVar30 = (ulong)(uVar21 & 0xff);
        uVar21 = POPCOUNT(uVar21 & 0xff);
        iVar22 = 0;
        if (uVar21 <= uVar28) {
          do {
            k = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar69 = ZEXT1664(auVar69._0_16_);
            bVar32 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar32) {
              terminated.field_0.i[k] = -1;
            }
            uVar30 = uVar30 & uVar30 - 1;
          } while (uVar30 != 0);
          auVar45 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
          iVar22 = 3;
          auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar45[0xf] < '\0') {
            auVar69 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar45._8_4_ = 0xff800000;
            auVar45._0_8_ = 0xff800000ff800000;
            auVar45._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar45,
                               (undefined1  [16])terminated.field_0);
            iVar22 = 2;
          }
        }
        if (uVar28 < uVar21) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0032795d;
              auVar45 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar234,6);
              if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar45 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar45[0xf]) goto LAB_0032796e;
              uVar30 = (ulong)((uint)root.ptr & 0xf);
              if (uVar30 == 8) {
                auVar45 = vpcmpeqd_avx(auVar69._0_16_,auVar69._0_16_);
                aVar47 = terminated.field_0;
                goto LAB_0032791f;
              }
              auVar77._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar77._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar77._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar25 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              uVar27 = 0;
              goto LAB_003268f4;
            }
            auVar235 = ZEXT1664(auVar217._0_16_);
            uVar30 = 0;
            uVar27 = 8;
            do {
              uVar24 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar30 * 8);
              if (uVar24 != 8) {
                uVar23 = *(undefined4 *)(root.ptr + 0x20 + uVar30 * 4);
                auVar34._4_4_ = uVar23;
                auVar34._0_4_ = uVar23;
                auVar34._8_4_ = uVar23;
                auVar34._12_4_ = uVar23;
                auVar10._8_8_ = tray.org.field_0._8_8_;
                auVar10._0_8_ = tray.org.field_0._0_8_;
                auVar11._8_8_ = tray.org.field_0._24_8_;
                auVar11._0_8_ = tray.org.field_0._16_8_;
                auVar12._8_8_ = tray.org.field_0._40_8_;
                auVar12._0_8_ = tray.org.field_0._32_8_;
                auVar45 = vsubps_avx(auVar34,auVar10);
                auVar140._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar45._0_4_;
                auVar140._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar45._4_4_;
                auVar140._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar45._8_4_;
                auVar140._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar45._12_4_;
                uVar23 = *(undefined4 *)(root.ptr + 0x40 + uVar30 * 4);
                auVar35._4_4_ = uVar23;
                auVar35._0_4_ = uVar23;
                auVar35._8_4_ = uVar23;
                auVar35._12_4_ = uVar23;
                auVar45 = vsubps_avx(auVar35,auVar11);
                auVar167._0_4_ = tray.rdir.field_0._16_4_ * auVar45._0_4_;
                auVar167._4_4_ = tray.rdir.field_0._20_4_ * auVar45._4_4_;
                auVar167._8_4_ = tray.rdir.field_0._24_4_ * auVar45._8_4_;
                auVar167._12_4_ = tray.rdir.field_0._28_4_ * auVar45._12_4_;
                uVar23 = *(undefined4 *)(root.ptr + 0x60 + uVar30 * 4);
                auVar36._4_4_ = uVar23;
                auVar36._0_4_ = uVar23;
                auVar36._8_4_ = uVar23;
                auVar36._12_4_ = uVar23;
                auVar45 = vsubps_avx(auVar36,auVar12);
                auVar194._0_4_ = tray.rdir.field_0._32_4_ * auVar45._0_4_;
                auVar194._4_4_ = tray.rdir.field_0._36_4_ * auVar45._4_4_;
                auVar194._8_4_ = tray.rdir.field_0._40_4_ * auVar45._8_4_;
                auVar194._12_4_ = tray.rdir.field_0._44_4_ * auVar45._12_4_;
                uVar23 = *(undefined4 *)(root.ptr + 0x30 + uVar30 * 4);
                auVar37._4_4_ = uVar23;
                auVar37._0_4_ = uVar23;
                auVar37._8_4_ = uVar23;
                auVar37._12_4_ = uVar23;
                auVar45 = vsubps_avx(auVar37,auVar10);
                auVar51._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar45._0_4_;
                auVar51._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar45._4_4_;
                auVar51._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar45._8_4_;
                auVar51._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar45._12_4_;
                uVar23 = *(undefined4 *)(root.ptr + 0x50 + uVar30 * 4);
                auVar38._4_4_ = uVar23;
                auVar38._0_4_ = uVar23;
                auVar38._8_4_ = uVar23;
                auVar38._12_4_ = uVar23;
                auVar45 = vsubps_avx(auVar38,auVar11);
                auVar78._0_4_ = tray.rdir.field_0._16_4_ * auVar45._0_4_;
                auVar78._4_4_ = tray.rdir.field_0._20_4_ * auVar45._4_4_;
                auVar78._8_4_ = tray.rdir.field_0._24_4_ * auVar45._8_4_;
                auVar78._12_4_ = tray.rdir.field_0._28_4_ * auVar45._12_4_;
                uVar23 = *(undefined4 *)(root.ptr + 0x70 + uVar30 * 4);
                auVar39._4_4_ = uVar23;
                auVar39._0_4_ = uVar23;
                auVar39._8_4_ = uVar23;
                auVar39._12_4_ = uVar23;
                auVar45 = vsubps_avx(auVar39,auVar12);
                auVar106._0_4_ = tray.rdir.field_0._32_4_ * auVar45._0_4_;
                auVar106._4_4_ = tray.rdir.field_0._36_4_ * auVar45._4_4_;
                auVar106._8_4_ = tray.rdir.field_0._40_4_ * auVar45._8_4_;
                auVar106._12_4_ = tray.rdir.field_0._44_4_ * auVar45._12_4_;
                auVar45 = vminps_avx(auVar140,auVar51);
                auVar46 = vminps_avx(auVar167,auVar78);
                auVar45 = vmaxps_avx(auVar45,auVar46);
                auVar46 = vminps_avx(auVar194,auVar106);
                auVar45 = vmaxps_avx(auVar45,auVar46);
                auVar40._0_4_ = auVar223._0_4_ * auVar45._0_4_;
                auVar40._4_4_ = auVar223._4_4_ * auVar45._4_4_;
                auVar40._8_4_ = auVar223._8_4_ * auVar45._8_4_;
                auVar40._12_4_ = auVar223._12_4_ * auVar45._12_4_;
                auVar45 = vmaxps_avx(auVar140,auVar51);
                auVar46 = vmaxps_avx(auVar167,auVar78);
                auVar46 = vminps_avx(auVar45,auVar46);
                auVar45 = vmaxps_avx(auVar194,auVar106);
                auVar45 = vminps_avx(auVar46,auVar45);
                auVar52._0_4_ = auVar230._0_4_ * auVar45._0_4_;
                auVar52._4_4_ = auVar230._4_4_ * auVar45._4_4_;
                auVar52._8_4_ = auVar230._8_4_ * auVar45._8_4_;
                auVar52._12_4_ = auVar230._12_4_ * auVar45._12_4_;
                auVar45 = vmaxps_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
                auVar46 = vminps_avx(auVar52,(undefined1  [16])tray.tfar.field_0);
                auVar45 = vcmpps_avx(auVar45,auVar46,2);
                auVar69 = ZEXT1664(auVar45);
                if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar45[0xf] < '\0') {
                  auVar45 = vblendvps_avx(auVar217._0_16_,auVar40,auVar45);
                  if (uVar27 != 8) {
                    pNVar31->ptr = uVar27;
                    pNVar31 = pNVar31 + 1;
                    *paVar29 = auVar235._0_16_;
                    paVar29 = paVar29 + 1;
                  }
                  auVar235 = ZEXT1664(auVar45);
                  uVar27 = uVar24;
                }
              }
              aVar234 = auVar235._0_16_;
            } while ((uVar24 != 8) && (bVar32 = uVar30 < 3, uVar30 = uVar30 + 1, bVar32));
            iVar22 = 0;
            if (uVar27 == 8) {
LAB_00326897:
              bVar32 = false;
              iVar22 = 4;
            }
            else {
              auVar45 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar234,6);
              uVar23 = vmovmskps_avx(auVar45);
              bVar32 = true;
              if ((uint)POPCOUNT(uVar23) <= uVar28) {
                pNVar31->ptr = uVar27;
                pNVar31 = pNVar31 + 1;
                *paVar29 = aVar234;
                paVar29 = paVar29 + 1;
                goto LAB_00326897;
              }
            }
            root.ptr = uVar27;
          } while (bVar32);
        }
      }
      goto LAB_00327960;
    }
  }
  return;
  while( true ) {
    uVar27 = uVar27 + 1;
    lVar25 = lVar25 + 0x60;
    if (uVar30 - 8 <= uVar27) break;
LAB_003268f4:
    local_1a18 = auVar77;
    auVar235 = ZEXT1664(local_1a18);
    pSVar4 = context->scene;
    auVar206 = ZEXT1664(local_1a18);
    uVar24 = 0;
    while( true ) {
      auVar46 = auVar206._0_16_;
      auVar45 = auVar235._0_16_;
      uVar21 = *(uint *)(lVar25 + uVar24 * 4);
      if (uVar21 == 0xffffffff) break;
      uVar3 = *(uint *)(lVar25 + -0x10 + uVar24 * 4);
      pfVar5 = (pSVar4->vertices).items[uVar3];
      uVar26 = (ulong)*(uint *)(lVar25 + -0x50 + uVar24 * 4);
      fVar166 = pfVar5[uVar26];
      auVar126._4_4_ = fVar166;
      auVar126._0_4_ = fVar166;
      auVar126._8_4_ = fVar166;
      auVar126._12_4_ = fVar166;
      fVar166 = pfVar5[uVar26 + 1];
      auVar53._4_4_ = fVar166;
      auVar53._0_4_ = fVar166;
      auVar53._8_4_ = fVar166;
      auVar53._12_4_ = fVar166;
      fVar166 = pfVar5[uVar26 + 2];
      auVar79._4_4_ = fVar166;
      auVar79._0_4_ = fVar166;
      auVar79._8_4_ = fVar166;
      auVar79._12_4_ = fVar166;
      uVar26 = (ulong)*(uint *)(lVar25 + -0x20 + uVar24 * 4);
      fVar166 = pfVar5[uVar26];
      auVar228._4_4_ = fVar166;
      auVar228._0_4_ = fVar166;
      auVar228._8_4_ = fVar166;
      auVar228._12_4_ = fVar166;
      fVar166 = pfVar5[uVar26 + 1];
      auVar141._4_4_ = fVar166;
      auVar141._0_4_ = fVar166;
      auVar141._8_4_ = fVar166;
      auVar141._12_4_ = fVar166;
      fVar166 = pfVar5[uVar26 + 2];
      auVar168._4_4_ = fVar166;
      auVar168._0_4_ = fVar166;
      auVar168._8_4_ = fVar166;
      auVar168._12_4_ = fVar166;
      auVar45 = *(undefined1 (*) [16])(ray + 0x10);
      auVar96 = *(undefined1 (*) [16])(ray + 0x20);
      auVar109 = vsubps_avx(auVar53,auVar45);
      auVar155 = vsubps_avx(auVar79,auVar96);
      auVar156 = vsubps_avx(auVar141,auVar45);
      auVar157 = vsubps_avx(auVar168,auVar96);
      auVar77 = vsubps_avx(auVar156,auVar109);
      auVar110 = vsubps_avx(auVar157,auVar155);
      fVar8 = auVar109._0_4_;
      fVar166 = auVar156._0_4_ + fVar8;
      fVar105 = auVar109._4_4_;
      fVar176 = auVar156._4_4_ + fVar105;
      fVar72 = auVar109._8_4_;
      fVar177 = auVar156._8_4_ + fVar72;
      fVar123 = auVar109._12_4_;
      fVar179 = auVar156._12_4_ + fVar123;
      fVar236 = auVar155._0_4_;
      fVar181 = fVar236 + auVar157._0_4_;
      fVar239 = auVar155._4_4_;
      fVar187 = fVar239 + auVar157._4_4_;
      fVar241 = auVar155._8_4_;
      fVar189 = fVar241 + auVar157._8_4_;
      fVar243 = auVar155._12_4_;
      fVar191 = fVar243 + auVar157._12_4_;
      fVar70 = auVar110._0_4_;
      auVar142._0_4_ = fVar166 * fVar70;
      fVar73 = auVar110._4_4_;
      auVar142._4_4_ = fVar176 * fVar73;
      fVar180 = auVar110._8_4_;
      auVar142._8_4_ = fVar177 * fVar180;
      fVar208 = auVar110._12_4_;
      auVar142._12_4_ = fVar179 * fVar208;
      fVar71 = auVar77._0_4_;
      auVar195._0_4_ = fVar181 * fVar71;
      fVar178 = auVar77._4_4_;
      auVar195._4_4_ = fVar187 * fVar178;
      fVar201 = auVar77._8_4_;
      auVar195._8_4_ = fVar189 * fVar201;
      fVar210 = auVar77._12_4_;
      auVar195._12_4_ = fVar191 * fVar210;
      auVar110 = vsubps_avx(auVar195,auVar142);
      auVar77 = *(undefined1 (*) [16])ray;
      auVar199 = vsubps_avx(auVar126,auVar77);
      auVar193 = vsubps_avx(auVar228,auVar77);
      auVar213 = vsubps_avx(auVar193,auVar199);
      fVar221 = auVar213._0_4_;
      auVar183._0_4_ = fVar221 * fVar181;
      fVar224 = auVar213._4_4_;
      auVar183._4_4_ = fVar224 * fVar187;
      fVar225 = auVar213._8_4_;
      auVar183._8_4_ = fVar225 * fVar189;
      fVar226 = auVar213._12_4_;
      auVar183._12_4_ = fVar226 * fVar191;
      fVar181 = auVar199._0_4_;
      fVar200 = auVar193._0_4_ + fVar181;
      fVar187 = auVar199._4_4_;
      fVar207 = auVar193._4_4_ + fVar187;
      fVar189 = auVar199._8_4_;
      fVar209 = auVar193._8_4_ + fVar189;
      fVar191 = auVar199._12_4_;
      fVar211 = auVar193._12_4_ + fVar191;
      auVar229._0_4_ = fVar200 * fVar70;
      auVar229._4_4_ = fVar207 * fVar73;
      auVar229._8_4_ = fVar209 * fVar180;
      auVar229._12_4_ = fVar211 * fVar208;
      auVar213 = vsubps_avx(auVar229,auVar183);
      auVar184._0_4_ = fVar200 * fVar71;
      auVar184._4_4_ = fVar207 * fVar178;
      auVar184._8_4_ = fVar209 * fVar201;
      auVar184._12_4_ = fVar211 * fVar210;
      auVar169._0_4_ = fVar221 * fVar166;
      auVar169._4_4_ = fVar224 * fVar176;
      auVar169._8_4_ = fVar225 * fVar177;
      auVar169._12_4_ = fVar226 * fVar179;
      auVar41 = vsubps_avx(auVar169,auVar184);
      fVar176 = *(float *)(ray + 0x60);
      fVar177 = *(float *)(ray + 100);
      fVar179 = *(float *)(ray + 0x68);
      auVar16 = *(undefined1 (*) [12])(ray + 0x60);
      fVar200 = *(float *)(ray + 0x6c);
      fVar207 = *(float *)(ray + 0x50);
      fVar209 = *(float *)(ray + 0x54);
      fVar211 = *(float *)(ray + 0x58);
      auVar17 = *(undefined1 (*) [12])(ray + 0x50);
      fVar125 = *(float *)(ray + 0x5c);
      fVar75 = *(float *)(ray + 0x40);
      fVar76 = *(float *)(ray + 0x44);
      fVar99 = *(float *)(ray + 0x48);
      auVar18 = *(undefined1 (*) [12])(ray + 0x40);
      fVar100 = *(float *)(ray + 0x4c);
      local_1a78._0_4_ =
           fVar75 * auVar110._0_4_ + auVar41._0_4_ * fVar176 + fVar207 * auVar213._0_4_;
      local_1a78._4_4_ =
           fVar76 * auVar110._4_4_ + auVar41._4_4_ * fVar177 + fVar209 * auVar213._4_4_;
      fStack_1a70 = fVar99 * auVar110._8_4_ + auVar41._8_4_ * fVar179 + fVar211 * auVar213._8_4_;
      fStack_1a6c = fVar100 * auVar110._12_4_ + auVar41._12_4_ * fVar200 + fVar125 * auVar213._12_4_
      ;
      uVar26 = (ulong)*(uint *)(lVar25 + -0x40 + uVar24 * 4);
      fVar166 = pfVar5[uVar26 + 1];
      auVar54._4_4_ = fVar166;
      auVar54._0_4_ = fVar166;
      auVar54._8_4_ = fVar166;
      auVar54._12_4_ = fVar166;
      auVar45 = vsubps_avx(auVar54,auVar45);
      fVar166 = pfVar5[uVar26 + 2];
      auVar80._4_4_ = fVar166;
      auVar80._0_4_ = fVar166;
      auVar80._8_4_ = fVar166;
      auVar80._12_4_ = fVar166;
      auVar96 = vsubps_avx(auVar80,auVar96);
      auVar109 = vsubps_avx(auVar109,auVar45);
      auVar155 = vsubps_avx(auVar155,auVar96);
      fVar33 = fVar8 + auVar45._0_4_;
      fVar48 = fVar105 + auVar45._4_4_;
      fVar49 = fVar72 + auVar45._8_4_;
      fVar50 = fVar123 + auVar45._12_4_;
      fVar103 = fVar236 + auVar96._0_4_;
      fVar121 = fVar239 + auVar96._4_4_;
      fVar122 = fVar241 + auVar96._8_4_;
      fVar124 = fVar243 + auVar96._12_4_;
      fVar227 = auVar155._0_4_;
      auVar158._0_4_ = fVar227 * fVar33;
      fVar231 = auVar155._4_4_;
      auVar158._4_4_ = fVar231 * fVar48;
      fVar232 = auVar155._8_4_;
      auVar158._8_4_ = fVar232 * fVar49;
      fVar233 = auVar155._12_4_;
      auVar158._12_4_ = fVar233 * fVar50;
      fVar212 = auVar109._0_4_;
      auVar170._0_4_ = fVar212 * fVar103;
      fVar218 = auVar109._4_4_;
      auVar170._4_4_ = fVar218 * fVar121;
      fVar219 = auVar109._8_4_;
      auVar170._8_4_ = fVar219 * fVar122;
      fVar220 = auVar109._12_4_;
      auVar170._12_4_ = fVar220 * fVar124;
      auVar109 = vsubps_avx(auVar170,auVar158);
      fVar166 = pfVar5[uVar26];
      auVar171._4_4_ = fVar166;
      auVar171._0_4_ = fVar166;
      auVar171._8_4_ = fVar166;
      auVar171._12_4_ = fVar166;
      auVar77 = vsubps_avx(auVar171,auVar77);
      auVar155 = vsubps_avx(auVar199,auVar77);
      fVar237 = auVar155._0_4_;
      auVar107._0_4_ = fVar237 * fVar103;
      fVar240 = auVar155._4_4_;
      auVar107._4_4_ = fVar240 * fVar121;
      fVar242 = auVar155._8_4_;
      auVar107._8_4_ = fVar242 * fVar122;
      fVar244 = auVar155._12_4_;
      auVar107._12_4_ = fVar244 * fVar124;
      fVar166 = fVar181 + auVar77._0_4_;
      fVar103 = fVar187 + auVar77._4_4_;
      fVar121 = fVar189 + auVar77._8_4_;
      fVar122 = fVar191 + auVar77._12_4_;
      auVar185._0_4_ = fVar166 * fVar227;
      auVar185._4_4_ = fVar103 * fVar231;
      auVar185._8_4_ = fVar121 * fVar232;
      auVar185._12_4_ = fVar122 * fVar233;
      auVar155 = vsubps_avx(auVar185,auVar107);
      auVar186._0_4_ = fVar166 * fVar212;
      auVar186._4_4_ = fVar103 * fVar218;
      auVar186._8_4_ = fVar121 * fVar219;
      auVar186._12_4_ = fVar122 * fVar220;
      auVar41._0_4_ = fVar237 * fVar33;
      auVar41._4_4_ = fVar240 * fVar48;
      auVar41._8_4_ = fVar242 * fVar49;
      auVar41._12_4_ = fVar244 * fVar50;
      auVar110 = vsubps_avx(auVar41,auVar186);
      auVar196._0_4_ = fVar75 * auVar109._0_4_ + fVar176 * auVar110._0_4_ + fVar207 * auVar155._0_4_
      ;
      auVar196._4_4_ = fVar76 * auVar109._4_4_ + fVar177 * auVar110._4_4_ + fVar209 * auVar155._4_4_
      ;
      auVar196._8_4_ = fVar99 * auVar109._8_4_ + fVar179 * auVar110._8_4_ + fVar211 * auVar155._8_4_
      ;
      auVar196._12_4_ =
           fVar100 * auVar109._12_4_ + fVar200 * auVar110._12_4_ + fVar125 * auVar155._12_4_;
      auVar109 = vsubps_avx(auVar77,auVar193);
      fVar139 = auVar77._0_4_ + auVar193._0_4_;
      fVar152 = auVar77._4_4_ + auVar193._4_4_;
      fVar153 = auVar77._8_4_ + auVar193._8_4_;
      fVar154 = auVar77._12_4_ + auVar193._12_4_;
      auVar77 = vsubps_avx(auVar45,auVar156);
      fVar166 = auVar45._0_4_ + auVar156._0_4_;
      fVar103 = auVar45._4_4_ + auVar156._4_4_;
      fVar121 = auVar45._8_4_ + auVar156._8_4_;
      fVar122 = auVar45._12_4_ + auVar156._12_4_;
      auVar45 = vsubps_avx(auVar96,auVar157);
      fVar124 = auVar96._0_4_ + auVar157._0_4_;
      fVar98 = auVar96._4_4_ + auVar157._4_4_;
      fVar101 = auVar96._8_4_ + auVar157._8_4_;
      fVar102 = auVar96._12_4_ + auVar157._12_4_;
      fVar182 = auVar45._0_4_;
      auVar159._0_4_ = fVar182 * fVar166;
      fVar188 = auVar45._4_4_;
      auVar159._4_4_ = fVar188 * fVar103;
      fVar190 = auVar45._8_4_;
      auVar159._8_4_ = fVar190 * fVar121;
      fVar192 = auVar45._12_4_;
      auVar159._12_4_ = fVar192 * fVar122;
      fVar33 = auVar77._0_4_;
      auVar172._0_4_ = fVar33 * fVar124;
      fVar48 = auVar77._4_4_;
      auVar172._4_4_ = fVar48 * fVar98;
      fVar49 = auVar77._8_4_;
      auVar172._8_4_ = fVar49 * fVar101;
      fVar50 = auVar77._12_4_;
      auVar172._12_4_ = fVar50 * fVar102;
      auVar45 = vsubps_avx(auVar172,auVar159);
      fVar104 = auVar109._0_4_;
      auVar81._0_4_ = fVar104 * fVar124;
      fVar124 = auVar109._4_4_;
      auVar81._4_4_ = fVar124 * fVar98;
      fVar98 = auVar109._8_4_;
      auVar81._8_4_ = fVar98 * fVar101;
      fVar101 = auVar109._12_4_;
      auVar81._12_4_ = fVar101 * fVar102;
      auVar173._0_4_ = fVar182 * fVar139;
      auVar173._4_4_ = fVar188 * fVar152;
      auVar173._8_4_ = fVar190 * fVar153;
      auVar173._12_4_ = fVar192 * fVar154;
      auVar96 = vsubps_avx(auVar173,auVar81);
      auVar143._0_4_ = fVar139 * fVar33;
      auVar143._4_4_ = fVar152 * fVar48;
      auVar143._8_4_ = fVar153 * fVar49;
      auVar143._12_4_ = fVar154 * fVar50;
      auVar55._0_4_ = fVar104 * fVar166;
      auVar55._4_4_ = fVar124 * fVar103;
      auVar55._8_4_ = fVar98 * fVar121;
      auVar55._12_4_ = fVar101 * fVar122;
      auVar77 = vsubps_avx(auVar55,auVar143);
      auVar222._8_4_ = 0x7fffffff;
      auVar222._0_8_ = 0x7fffffff7fffffff;
      auVar222._12_4_ = 0x7fffffff;
      auVar56._0_4_ = fVar75 * auVar45._0_4_ + fVar176 * auVar77._0_4_ + fVar207 * auVar96._0_4_;
      auVar56._4_4_ = fVar76 * auVar45._4_4_ + fVar177 * auVar77._4_4_ + fVar209 * auVar96._4_4_;
      auVar56._8_4_ = fVar99 * auVar45._8_4_ + fVar179 * auVar77._8_4_ + fVar211 * auVar96._8_4_;
      auVar56._12_4_ =
           fVar100 * auVar45._12_4_ + fVar200 * auVar77._12_4_ + fVar125 * auVar96._12_4_;
      auVar127._0_4_ = auVar56._0_4_ + auVar196._0_4_ + (float)local_1a78._0_4_;
      auVar127._4_4_ = auVar56._4_4_ + auVar196._4_4_ + (float)local_1a78._4_4_;
      auVar127._8_4_ = auVar56._8_4_ + auVar196._8_4_ + fStack_1a70;
      auVar127._12_4_ = auVar56._12_4_ + auVar196._12_4_ + fStack_1a6c;
      auVar45 = vminps_avx(_local_1a78,auVar196);
      auVar96 = vminps_avx(auVar45,auVar56);
      auVar45 = vandps_avx(auVar222,auVar127);
      auVar144._0_4_ = auVar45._0_4_ * 1.1920929e-07;
      auVar144._4_4_ = auVar45._4_4_ * 1.1920929e-07;
      auVar144._8_4_ = auVar45._8_4_ * 1.1920929e-07;
      auVar144._12_4_ = auVar45._12_4_ * 1.1920929e-07;
      uVar26 = CONCAT44(auVar144._4_4_,auVar144._0_4_);
      auVar160._0_8_ = uVar26 ^ 0x8000000080000000;
      auVar160._8_4_ = -auVar144._8_4_;
      auVar160._12_4_ = -auVar144._12_4_;
      auVar96 = vcmpps_avx(auVar96,auVar160,5);
      auVar77 = vmaxps_avx(_local_1a78,auVar196);
      auVar77 = vmaxps_avx(auVar77,auVar56);
      auVar77 = vcmpps_avx(auVar77,auVar144,2);
      auVar96 = vorps_avx(auVar96,auVar77);
      uVar26 = (ulong)*(uint *)(lVar25 + -0x30 + uVar24 * 4);
      auVar77 = auVar46 & auVar96;
      fVar166 = pfVar5[uVar26];
      fVar176 = pfVar5[uVar26 + 1];
      fVar177 = pfVar5[uVar26 + 2];
      auVar57._4_4_ = fVar177;
      auVar57._0_4_ = fVar177;
      auVar57._8_4_ = fVar177;
      auVar57._12_4_ = fVar177;
      auVar69 = ZEXT1664(auVar57);
      if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar77 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar77 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar77[0xf])
      {
        auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        auVar206 = ZEXT1664(auVar46);
      }
      else {
        auVar58._0_4_ = fVar212 * fVar70;
        auVar58._4_4_ = fVar218 * fVar73;
        auVar58._8_4_ = fVar219 * fVar180;
        auVar58._12_4_ = fVar220 * fVar208;
        auVar82._0_4_ = fVar227 * fVar71;
        auVar82._4_4_ = fVar231 * fVar178;
        auVar82._8_4_ = fVar232 * fVar201;
        auVar82._12_4_ = fVar233 * fVar210;
        auVar155 = vsubps_avx(auVar82,auVar58);
        auVar145._0_4_ = fVar227 * fVar33;
        auVar145._4_4_ = fVar231 * fVar48;
        auVar145._8_4_ = fVar232 * fVar49;
        auVar145._12_4_ = fVar233 * fVar50;
        auVar161._0_4_ = fVar212 * fVar182;
        auVar161._4_4_ = fVar218 * fVar188;
        auVar161._8_4_ = fVar219 * fVar190;
        auVar161._12_4_ = fVar220 * fVar192;
        auVar156 = vsubps_avx(auVar161,auVar145);
        auVar77 = vandps_avx(auVar222,auVar58);
        auVar109 = vandps_avx(auVar222,auVar145);
        auVar77 = vcmpps_avx(auVar77,auVar109,1);
        auVar155 = vblendvps_avx(auVar156,auVar155,auVar77);
        auVar59._0_4_ = fVar237 * fVar182;
        auVar59._4_4_ = fVar240 * fVar188;
        auVar59._8_4_ = fVar242 * fVar190;
        auVar59._12_4_ = fVar244 * fVar192;
        auVar83._0_4_ = fVar237 * fVar70;
        auVar83._4_4_ = fVar240 * fVar73;
        auVar83._8_4_ = fVar242 * fVar180;
        auVar83._12_4_ = fVar244 * fVar208;
        auVar146._0_4_ = fVar221 * fVar227;
        auVar146._4_4_ = fVar224 * fVar231;
        auVar146._8_4_ = fVar225 * fVar232;
        auVar146._12_4_ = fVar226 * fVar233;
        auVar156 = vsubps_avx(auVar83,auVar146);
        auVar162._0_4_ = fVar227 * fVar104;
        auVar162._4_4_ = fVar231 * fVar124;
        auVar162._8_4_ = fVar232 * fVar98;
        auVar162._12_4_ = fVar233 * fVar101;
        auVar157 = vsubps_avx(auVar162,auVar59);
        auVar77 = vandps_avx(auVar222,auVar146);
        auVar109 = vandps_avx(auVar222,auVar59);
        auVar77 = vcmpps_avx(auVar77,auVar109,1);
        auVar156 = vblendvps_avx(auVar157,auVar156,auVar77);
        auVar60._0_4_ = fVar212 * fVar104;
        auVar60._4_4_ = fVar218 * fVar124;
        auVar60._8_4_ = fVar219 * fVar98;
        auVar60._12_4_ = fVar220 * fVar101;
        auVar84._0_4_ = fVar221 * fVar212;
        auVar84._4_4_ = fVar224 * fVar218;
        auVar84._8_4_ = fVar225 * fVar219;
        auVar84._12_4_ = fVar226 * fVar220;
        auVar108._0_4_ = fVar237 * fVar71;
        auVar108._4_4_ = fVar240 * fVar178;
        auVar108._8_4_ = fVar242 * fVar201;
        auVar108._12_4_ = fVar244 * fVar210;
        auVar42._0_4_ = fVar237 * fVar33;
        auVar42._4_4_ = fVar240 * fVar48;
        auVar42._8_4_ = fVar242 * fVar49;
        auVar42._12_4_ = fVar244 * fVar50;
        auVar157 = vsubps_avx(auVar84,auVar108);
        auVar110 = vsubps_avx(auVar42,auVar60);
        auVar77 = vandps_avx(auVar222,auVar108);
        auVar109 = vandps_avx(auVar222,auVar60);
        auVar77 = vcmpps_avx(auVar77,auVar109,1);
        auVar157 = vblendvps_avx(auVar110,auVar157,auVar77);
        local_1a48 = auVar16._0_4_;
        fStack_1a44 = auVar16._4_4_;
        fStack_1a40 = auVar16._8_4_;
        local_1a38 = auVar17._0_4_;
        fStack_1a34 = auVar17._4_4_;
        fStack_1a30 = auVar17._8_4_;
        local_1978 = auVar18._0_4_;
        fStack_1974 = auVar18._4_4_;
        fStack_1970 = auVar18._8_4_;
        fVar177 = auVar155._0_4_ * local_1978 +
                  auVar157._0_4_ * local_1a48 + auVar156._0_4_ * local_1a38;
        fVar70 = auVar155._4_4_ * fStack_1974 +
                 auVar157._4_4_ * fStack_1a44 + auVar156._4_4_ * fStack_1a34;
        fVar71 = auVar155._8_4_ * fStack_1970 +
                 auVar157._8_4_ * fStack_1a40 + auVar156._8_4_ * fStack_1a30;
        fVar73 = auVar155._12_4_ * fVar100 + auVar157._12_4_ * fVar200 + auVar156._12_4_ * fVar125;
        auVar85._0_4_ = fVar177 + fVar177;
        auVar85._4_4_ = fVar70 + fVar70;
        auVar85._8_4_ = fVar71 + fVar71;
        auVar85._12_4_ = fVar73 + fVar73;
        fVar70 = auVar155._0_4_ * fVar181 + auVar157._0_4_ * fVar236 + auVar156._0_4_ * fVar8;
        fVar187 = auVar155._4_4_ * fVar187 + auVar157._4_4_ * fVar239 + auVar156._4_4_ * fVar105;
        fVar72 = auVar155._8_4_ * fVar189 + auVar157._8_4_ * fVar241 + auVar156._8_4_ * fVar72;
        fVar189 = auVar155._12_4_ * fVar191 + auVar157._12_4_ * fVar243 + auVar156._12_4_ * fVar123;
        auVar77 = vrcpps_avx(auVar85);
        fVar177 = auVar77._0_4_;
        auVar128._0_4_ = auVar85._0_4_ * fVar177;
        fVar8 = auVar77._4_4_;
        auVar128._4_4_ = auVar85._4_4_ * fVar8;
        fVar181 = auVar77._8_4_;
        auVar128._8_4_ = auVar85._8_4_ * fVar181;
        fVar105 = auVar77._12_4_;
        auVar128._12_4_ = auVar85._12_4_ * fVar105;
        auVar147._8_4_ = 0x3f800000;
        auVar147._0_8_ = &DAT_3f8000003f800000;
        auVar147._12_4_ = 0x3f800000;
        auVar77 = vsubps_avx(auVar147,auVar128);
        auVar61._0_4_ = (fVar70 + fVar70) * (fVar177 + fVar177 * auVar77._0_4_);
        auVar61._4_4_ = (fVar187 + fVar187) * (fVar8 + fVar8 * auVar77._4_4_);
        auVar61._8_4_ = (fVar72 + fVar72) * (fVar181 + fVar181 * auVar77._8_4_);
        auVar61._12_4_ = (fVar189 + fVar189) * (fVar105 + fVar105 * auVar77._12_4_);
        auVar69 = ZEXT1664(auVar61);
        auVar77 = *(undefined1 (*) [16])(ray + 0x80);
        auVar109 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar61,2);
        auVar110 = vcmpps_avx(auVar61,auVar77,2);
        auVar109 = vandps_avx(auVar109,auVar110);
        auVar199 = ZEXT816(0) << 0x20;
        auVar110 = vcmpps_avx(auVar199,auVar85,4);
        auVar109 = vandps_avx(auVar110,auVar109);
        auVar96 = vandps_avx(auVar46,auVar96);
        auVar109 = vpslld_avx(auVar109,0x1f);
        auVar110 = vpsrad_avx(auVar109,0x1f);
        auVar109 = auVar96 & auVar110;
        auVar206 = ZEXT1664(auVar46);
        if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar109 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar109 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar109[0xf]) {
          auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar96 = vandps_avx(auVar110,auVar96);
          pGVar6 = (context->scene->geometries).items[uVar3].ptr;
          uVar2 = pGVar6->mask;
          auVar111._4_4_ = uVar2;
          auVar111._0_4_ = uVar2;
          auVar111._8_4_ = uVar2;
          auVar111._12_4_ = uVar2;
          auVar109 = vandps_avx(auVar111,*(undefined1 (*) [16])(ray + 0x90));
          auVar109 = vpcmpeqd_avx(auVar199,auVar109);
          auVar193 = auVar96 & ~auVar109;
          auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar110 = vpcmpeqd_avx(auVar196,auVar196);
          if ((((auVar193 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar193 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar193 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar193[0xf] < '\0') {
            auVar96 = vandnps_avx(auVar109,auVar96);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar109 = vrcpps_avx(auVar127);
              fVar177 = auVar109._0_4_;
              auVar136._0_4_ = auVar127._0_4_ * fVar177;
              fVar8 = auVar109._4_4_;
              auVar136._4_4_ = auVar127._4_4_ * fVar8;
              fVar181 = auVar109._8_4_;
              auVar136._8_4_ = auVar127._8_4_ * fVar181;
              fVar105 = auVar109._12_4_;
              auVar136._12_4_ = auVar127._12_4_ * fVar105;
              auVar175._8_4_ = 0x3f800000;
              auVar175._0_8_ = &DAT_3f8000003f800000;
              auVar175._12_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar175,auVar136);
              auVar116._0_4_ = fVar177 + fVar177 * auVar109._0_4_;
              auVar116._4_4_ = fVar8 + fVar8 * auVar109._4_4_;
              auVar116._8_4_ = fVar181 + fVar181 * auVar109._8_4_;
              auVar116._12_4_ = fVar105 + fVar105 * auVar109._12_4_;
              auVar137._8_4_ = 0x219392ef;
              auVar137._0_8_ = 0x219392ef219392ef;
              auVar137._12_4_ = 0x219392ef;
              auVar45 = vcmpps_avx(auVar45,auVar137,5);
              auVar45 = vandps_avx(auVar45,auVar116);
              auVar138._0_4_ = auVar45._0_4_ * (float)local_1a78._0_4_;
              auVar138._4_4_ = auVar45._4_4_ * (float)local_1a78._4_4_;
              auVar138._8_4_ = auVar45._8_4_ * fStack_1a70;
              auVar138._12_4_ = auVar45._12_4_ * fStack_1a6c;
              auVar109 = vminps_avx(auVar138,auVar175);
              auVar117._0_4_ = auVar196._0_4_ * auVar45._0_4_;
              auVar117._4_4_ = auVar196._4_4_ * auVar45._4_4_;
              auVar117._8_4_ = auVar196._8_4_ * auVar45._8_4_;
              auVar117._12_4_ = auVar196._12_4_ * auVar45._12_4_;
              auVar45 = vminps_avx(auVar117,auVar175);
              auVar193 = vsubps_avx(auVar175,auVar109);
              auVar213 = vsubps_avx(auVar175,auVar45);
              auVar13._8_8_ = uVar20;
              auVar13._0_8_ = uVar19;
              local_18c8 = vblendvps_avx(auVar109,auVar193,auVar13);
              local_18b8 = vblendvps_avx(auVar45,auVar213,auVar13);
              local_1898 = vpshufd_avx(ZEXT416(uVar3),0);
              local_18a8 = vpshufd_avx(ZEXT416(uVar21),0);
              vcmpps_avx(ZEXT1632(auVar157),ZEXT1632(auVar157),0xf);
              uStack_1884 = context->user->instID[0];
              local_1888 = uStack_1884;
              uStack_1880 = uStack_1884;
              uStack_187c = uStack_1884;
              uStack_1878 = context->user->instPrimID[0];
              uStack_1874 = uStack_1878;
              uStack_1870 = uStack_1878;
              uStack_186c = uStack_1878;
              auVar45 = vblendvps_avx(auVar77,auVar61,auVar96);
              *(undefined1 (*) [16])(ray + 0x80) = auVar45;
              args.valid = (int *)local_1a28;
              args.geometryUserPtr = pGVar6->userPtr;
              args.context = context->user;
              args.hit = local_18f8;
              args.N = 4;
              local_1a28 = auVar96;
              args.ray = (RTCRayN *)ray;
              local_18f8 = (RTCHitN  [16])auVar155;
              local_18e8 = auVar156;
              local_18d8 = auVar157;
              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar6->occlusionFilterN)(&args);
                auVar199 = ZEXT816(0) << 0x40;
                auVar110 = vpcmpeqd_avx(auVar110,auVar110);
                auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              if (local_1a28 == (undefined1  [16])0x0) {
                auVar45 = vpcmpeqd_avx(auVar199,(undefined1  [16])0x0);
                auVar110 = auVar110 ^ auVar45;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var7)(&args);
                  auVar199 = ZEXT816(0) << 0x40;
                  auVar110 = vpcmpeqd_avx(auVar110,auVar110);
                  auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                auVar45 = vpcmpeqd_avx(auVar199,local_1a28);
                auVar110 = auVar110 ^ auVar45;
                auVar92._8_4_ = 0xff800000;
                auVar92._0_8_ = 0xff800000ff800000;
                auVar92._12_4_ = 0xff800000;
                auVar45 = vblendvps_avx(auVar92,*(undefined1 (*) [16])(args.ray + 0x80),auVar45);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar45;
              }
              auVar45 = vpslld_avx(auVar110,0x1f);
              auVar96 = vpsrad_avx(auVar45,0x1f);
              auVar69 = ZEXT1664(auVar77);
              auVar45 = vblendvps_avx(auVar77,*(undefined1 (*) [16])pRVar1,auVar45);
              *(undefined1 (*) [16])pRVar1 = auVar45;
            }
            auVar45 = vpandn_avx(auVar96,auVar46);
            auVar206 = ZEXT1664(auVar45);
          }
        }
      }
      auVar45 = auVar206._0_16_;
      if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar45 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar206[0xf])
      {
        bVar32 = false;
        auVar235 = ZEXT1664(local_1a18);
      }
      else {
        auVar46 = *(undefined1 (*) [16])ray;
        auVar96 = *(undefined1 (*) [16])(ray + 0x10);
        auVar77 = *(undefined1 (*) [16])(ray + 0x20);
        auVar15._4_4_ = fVar166;
        auVar15._0_4_ = fVar166;
        auVar15._8_4_ = fVar166;
        auVar15._12_4_ = fVar166;
        auVar109 = vsubps_avx(auVar15,auVar46);
        auVar14._4_4_ = fVar176;
        auVar14._0_4_ = fVar176;
        auVar14._8_4_ = fVar176;
        auVar14._12_4_ = fVar176;
        auVar155 = vsubps_avx(auVar14,auVar96);
        auVar156 = vsubps_avx(auVar57,auVar77);
        auVar157 = vsubps_avx(auVar228,auVar46);
        auVar110 = vsubps_avx(auVar141,auVar96);
        auVar199 = vsubps_avx(auVar168,auVar77);
        auVar46 = vsubps_avx(auVar171,auVar46);
        auVar96 = vsubps_avx(auVar54,auVar96);
        auVar77 = vsubps_avx(auVar80,auVar77);
        auVar193 = vsubps_avx(auVar46,auVar109);
        auVar213 = vsubps_avx(auVar96,auVar155);
        auVar41 = vsubps_avx(auVar77,auVar156);
        fVar166 = auVar155._0_4_;
        fVar105 = auVar96._0_4_ + fVar166;
        fVar176 = auVar155._4_4_;
        fVar72 = auVar96._4_4_ + fVar176;
        fVar177 = auVar155._8_4_;
        fVar123 = auVar96._8_4_ + fVar177;
        fVar8 = auVar155._12_4_;
        fVar70 = auVar96._12_4_ + fVar8;
        fVar231 = auVar156._0_4_;
        fVar71 = fVar231 + auVar77._0_4_;
        fVar233 = auVar156._4_4_;
        fVar73 = fVar233 + auVar77._4_4_;
        fVar237 = auVar156._8_4_;
        fVar178 = fVar237 + auVar77._8_4_;
        fVar240 = auVar156._12_4_;
        fVar180 = fVar240 + auVar77._12_4_;
        fVar181 = auVar41._0_4_;
        auVar202._0_4_ = fVar105 * fVar181;
        fVar187 = auVar41._4_4_;
        auVar202._4_4_ = fVar72 * fVar187;
        fVar189 = auVar41._8_4_;
        auVar202._8_4_ = fVar123 * fVar189;
        fVar191 = auVar41._12_4_;
        auVar202._12_4_ = fVar70 * fVar191;
        fVar188 = auVar213._0_4_;
        auVar214._0_4_ = fVar188 * fVar71;
        fVar190 = auVar213._4_4_;
        auVar214._4_4_ = fVar190 * fVar73;
        fVar192 = auVar213._8_4_;
        auVar214._8_4_ = fVar192 * fVar178;
        fVar212 = auVar213._12_4_;
        auVar214._12_4_ = fVar212 * fVar180;
        auVar213 = vsubps_avx(auVar214,auVar202);
        fVar152 = auVar109._0_4_;
        fVar201 = fVar152 + auVar46._0_4_;
        fVar153 = auVar109._4_4_;
        fVar208 = fVar153 + auVar46._4_4_;
        fVar154 = auVar109._8_4_;
        fVar210 = fVar154 + auVar46._8_4_;
        fVar182 = auVar109._12_4_;
        fVar179 = fVar182 + auVar46._12_4_;
        fVar75 = auVar193._0_4_;
        auVar174._0_4_ = fVar75 * fVar71;
        fVar99 = auVar193._4_4_;
        auVar174._4_4_ = fVar99 * fVar73;
        fVar33 = auVar193._8_4_;
        auVar174._8_4_ = fVar33 * fVar178;
        fVar49 = auVar193._12_4_;
        auVar174._12_4_ = fVar49 * fVar180;
        auVar215._0_4_ = fVar201 * fVar181;
        auVar215._4_4_ = fVar208 * fVar187;
        auVar215._8_4_ = fVar210 * fVar189;
        auVar215._12_4_ = fVar179 * fVar191;
        auVar193 = vsubps_avx(auVar215,auVar174);
        auVar203._0_4_ = fVar201 * fVar188;
        auVar203._4_4_ = fVar208 * fVar190;
        auVar203._8_4_ = fVar210 * fVar192;
        auVar203._12_4_ = fVar179 * fVar212;
        auVar112._0_4_ = fVar75 * fVar105;
        auVar112._4_4_ = fVar99 * fVar72;
        auVar112._8_4_ = fVar33 * fVar123;
        auVar112._12_4_ = fVar49 * fVar70;
        auVar41 = vsubps_avx(auVar112,auVar203);
        fVar71 = *(float *)(ray + 0x60);
        fVar73 = *(float *)(ray + 100);
        fVar178 = *(float *)(ray + 0x68);
        auVar17 = *(undefined1 (*) [12])(ray + 0x60);
        fVar180 = *(float *)(ray + 0x6c);
        auVar16 = *(undefined1 (*) [12])(ray + 0x50);
        fVar201 = *(float *)(ray + 0x5c);
        fVar208 = *(float *)(ray + 0x40);
        fVar210 = *(float *)(ray + 0x44);
        fVar179 = *(float *)(ray + 0x48);
        auVar18 = *(undefined1 (*) [12])(ray + 0x40);
        fVar200 = *(float *)(ray + 0x4c);
        auVar216._0_4_ =
             fVar208 * auVar213._0_4_ +
             fVar71 * auVar41._0_4_ + *(float *)(ray + 0x50) * auVar193._0_4_;
        auVar216._4_4_ =
             fVar210 * auVar213._4_4_ +
             fVar73 * auVar41._4_4_ + *(float *)(ray + 0x54) * auVar193._4_4_;
        auVar216._8_4_ =
             fVar179 * auVar213._8_4_ +
             fVar178 * auVar41._8_4_ + *(float *)(ray + 0x58) * auVar193._8_4_;
        auVar216._12_4_ =
             fVar200 * auVar213._12_4_ + fVar180 * auVar41._12_4_ + fVar201 * auVar193._12_4_;
        auVar155 = vsubps_avx(auVar155,auVar110);
        auVar156 = vsubps_avx(auVar156,auVar199);
        fVar207 = fVar166 + auVar110._0_4_;
        fVar209 = fVar176 + auVar110._4_4_;
        fVar211 = fVar177 + auVar110._8_4_;
        fVar125 = fVar8 + auVar110._12_4_;
        fVar105 = fVar231 + auVar199._0_4_;
        fVar72 = fVar233 + auVar199._4_4_;
        fVar123 = fVar237 + auVar199._8_4_;
        fVar70 = fVar240 + auVar199._12_4_;
        fVar218 = auVar156._0_4_;
        auVar238._0_4_ = fVar218 * fVar207;
        fVar219 = auVar156._4_4_;
        auVar238._4_4_ = fVar219 * fVar209;
        fVar220 = auVar156._8_4_;
        auVar238._8_4_ = fVar220 * fVar211;
        fVar221 = auVar156._12_4_;
        auVar238._12_4_ = fVar221 * fVar125;
        fVar101 = auVar155._0_4_;
        auVar129._0_4_ = fVar101 * fVar105;
        fVar102 = auVar155._4_4_;
        auVar129._4_4_ = fVar102 * fVar72;
        fVar104 = auVar155._8_4_;
        auVar129._8_4_ = fVar104 * fVar123;
        fVar139 = auVar155._12_4_;
        auVar129._12_4_ = fVar139 * fVar70;
        auVar155 = vsubps_avx(auVar129,auVar238);
        auVar109 = vsubps_avx(auVar109,auVar157);
        fVar232 = auVar109._0_4_;
        auVar86._0_4_ = fVar232 * fVar105;
        fVar236 = auVar109._4_4_;
        auVar86._4_4_ = fVar236 * fVar72;
        fVar239 = auVar109._8_4_;
        auVar86._8_4_ = fVar239 * fVar123;
        fVar241 = auVar109._12_4_;
        auVar86._12_4_ = fVar241 * fVar70;
        fVar105 = fVar152 + auVar157._0_4_;
        fVar72 = fVar153 + auVar157._4_4_;
        fVar123 = fVar154 + auVar157._8_4_;
        fVar70 = fVar182 + auVar157._12_4_;
        auVar204._0_4_ = fVar105 * fVar218;
        auVar204._4_4_ = fVar72 * fVar219;
        auVar204._8_4_ = fVar123 * fVar220;
        auVar204._12_4_ = fVar70 * fVar221;
        auVar109 = vsubps_avx(auVar204,auVar86);
        auVar197._0_4_ = fVar105 * fVar101;
        auVar197._4_4_ = fVar72 * fVar102;
        auVar197._8_4_ = fVar123 * fVar104;
        auVar197._12_4_ = fVar70 * fVar139;
        auVar113._0_4_ = fVar232 * fVar207;
        auVar113._4_4_ = fVar236 * fVar209;
        auVar113._8_4_ = fVar239 * fVar211;
        auVar113._12_4_ = fVar241 * fVar125;
        auVar156 = vsubps_avx(auVar113,auVar197);
        local_1a48 = auVar16._0_4_;
        fStack_1a44 = auVar16._4_4_;
        fStack_1a40 = auVar16._8_4_;
        auVar198._0_4_ =
             fVar208 * auVar155._0_4_ + fVar71 * auVar156._0_4_ + local_1a48 * auVar109._0_4_;
        auVar198._4_4_ =
             fVar210 * auVar155._4_4_ + fVar73 * auVar156._4_4_ + fStack_1a44 * auVar109._4_4_;
        auVar198._8_4_ =
             fVar179 * auVar155._8_4_ + fVar178 * auVar156._8_4_ + fStack_1a40 * auVar109._8_4_;
        auVar198._12_4_ =
             fVar200 * auVar155._12_4_ + fVar180 * auVar156._12_4_ + fVar201 * auVar109._12_4_;
        auVar109 = vsubps_avx(auVar157,auVar46);
        fVar207 = auVar157._0_4_ + auVar46._0_4_;
        fVar209 = auVar157._4_4_ + auVar46._4_4_;
        fVar211 = auVar157._8_4_ + auVar46._8_4_;
        fVar125 = auVar157._12_4_ + auVar46._12_4_;
        auVar46 = vsubps_avx(auVar110,auVar96);
        fVar76 = auVar110._0_4_ + auVar96._0_4_;
        fVar100 = auVar110._4_4_ + auVar96._4_4_;
        fVar48 = auVar110._8_4_ + auVar96._8_4_;
        fVar50 = auVar110._12_4_ + auVar96._12_4_;
        auVar96 = vsubps_avx(auVar199,auVar77);
        fVar121 = auVar199._0_4_ + auVar77._0_4_;
        fVar122 = auVar199._4_4_ + auVar77._4_4_;
        fVar124 = auVar199._8_4_ + auVar77._8_4_;
        fVar98 = auVar199._12_4_ + auVar77._12_4_;
        fVar105 = auVar96._0_4_;
        auVar148._0_4_ = fVar76 * fVar105;
        fVar72 = auVar96._4_4_;
        auVar148._4_4_ = fVar100 * fVar72;
        fVar123 = auVar96._8_4_;
        auVar148._8_4_ = fVar48 * fVar123;
        fVar70 = auVar96._12_4_;
        auVar148._12_4_ = fVar50 * fVar70;
        fVar224 = auVar46._0_4_;
        auVar163._0_4_ = fVar224 * fVar121;
        fVar225 = auVar46._4_4_;
        auVar163._4_4_ = fVar225 * fVar122;
        fVar226 = auVar46._8_4_;
        auVar163._8_4_ = fVar226 * fVar124;
        fVar227 = auVar46._12_4_;
        auVar163._12_4_ = fVar227 * fVar98;
        auVar46 = vsubps_avx(auVar163,auVar148);
        fVar103 = auVar109._0_4_;
        auVar130._0_4_ = fVar103 * fVar121;
        fVar121 = auVar109._4_4_;
        auVar130._4_4_ = fVar121 * fVar122;
        fVar122 = auVar109._8_4_;
        auVar130._8_4_ = fVar122 * fVar124;
        fVar124 = auVar109._12_4_;
        auVar130._12_4_ = fVar124 * fVar98;
        auVar164._0_4_ = fVar207 * fVar105;
        auVar164._4_4_ = fVar209 * fVar72;
        auVar164._8_4_ = fVar211 * fVar123;
        auVar164._12_4_ = fVar125 * fVar70;
        auVar96 = vsubps_avx(auVar164,auVar130);
        auVar62._0_4_ = fVar224 * fVar207;
        auVar62._4_4_ = fVar225 * fVar209;
        auVar62._8_4_ = fVar226 * fVar211;
        auVar62._12_4_ = fVar227 * fVar125;
        auVar87._0_4_ = fVar103 * fVar76;
        auVar87._4_4_ = fVar121 * fVar100;
        auVar87._8_4_ = fVar122 * fVar48;
        auVar87._12_4_ = fVar124 * fVar50;
        auVar77 = vsubps_avx(auVar87,auVar62);
        auVar63._0_4_ =
             fVar208 * auVar46._0_4_ + fVar71 * auVar77._0_4_ + local_1a48 * auVar96._0_4_;
        auVar63._4_4_ =
             fVar210 * auVar46._4_4_ + fVar73 * auVar77._4_4_ + fStack_1a44 * auVar96._4_4_;
        auVar63._8_4_ =
             fVar179 * auVar46._8_4_ + fVar178 * auVar77._8_4_ + fStack_1a40 * auVar96._8_4_;
        auVar63._12_4_ =
             fVar200 * auVar46._12_4_ + fVar180 * auVar77._12_4_ + fVar201 * auVar96._12_4_;
        auVar131._0_4_ = auVar63._0_4_ + auVar216._0_4_ + auVar198._0_4_;
        auVar131._4_4_ = auVar63._4_4_ + auVar216._4_4_ + auVar198._4_4_;
        auVar131._8_4_ = auVar63._8_4_ + auVar216._8_4_ + auVar198._8_4_;
        auVar131._12_4_ = auVar63._12_4_ + auVar216._12_4_ + auVar198._12_4_;
        auVar46 = vminps_avx(auVar216,auVar198);
        auVar96 = vminps_avx(auVar46,auVar63);
        auVar205._8_4_ = 0x7fffffff;
        auVar205._0_8_ = 0x7fffffff7fffffff;
        auVar205._12_4_ = 0x7fffffff;
        auVar46 = vandps_avx(auVar205,auVar131);
        auVar132._0_4_ = auVar46._0_4_ * 1.1920929e-07;
        auVar132._4_4_ = auVar46._4_4_ * 1.1920929e-07;
        auVar132._8_4_ = auVar46._8_4_ * 1.1920929e-07;
        auVar132._12_4_ = auVar46._12_4_ * 1.1920929e-07;
        uVar26 = CONCAT44(auVar132._4_4_,auVar132._0_4_);
        auVar149._0_8_ = uVar26 ^ 0x8000000080000000;
        auVar149._8_4_ = -auVar132._8_4_;
        auVar149._12_4_ = -auVar132._12_4_;
        auVar96 = vcmpps_avx(auVar96,auVar149,5);
        auVar77 = vmaxps_avx(auVar216,auVar198);
        auVar77 = vmaxps_avx(auVar77,auVar63);
        auVar77 = vcmpps_avx(auVar77,auVar132,2);
        auVar69 = ZEXT1664(auVar77);
        auVar96 = vorps_avx(auVar96,auVar77);
        auVar77 = auVar45 & auVar96;
        if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar77 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar77 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar77[0xf]
           ) {
          auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar235 = ZEXT1664(local_1a18);
          auVar206 = ZEXT1664(auVar45);
        }
        else {
          auVar64._0_4_ = fVar181 * fVar101;
          auVar64._4_4_ = fVar187 * fVar102;
          auVar64._8_4_ = fVar189 * fVar104;
          auVar64._12_4_ = fVar191 * fVar139;
          auVar88._0_4_ = fVar188 * fVar218;
          auVar88._4_4_ = fVar190 * fVar219;
          auVar88._8_4_ = fVar192 * fVar220;
          auVar88._12_4_ = fVar212 * fVar221;
          auVar155 = vsubps_avx(auVar88,auVar64);
          auVar133._0_4_ = fVar224 * fVar218;
          auVar133._4_4_ = fVar225 * fVar219;
          auVar133._8_4_ = fVar226 * fVar220;
          auVar133._12_4_ = fVar227 * fVar221;
          auVar150._0_4_ = fVar101 * fVar105;
          auVar150._4_4_ = fVar102 * fVar72;
          auVar150._8_4_ = fVar104 * fVar123;
          auVar150._12_4_ = fVar139 * fVar70;
          auVar156 = vsubps_avx(auVar150,auVar133);
          auVar77 = vandps_avx(auVar205,auVar64);
          auVar109 = vandps_avx(auVar205,auVar133);
          auVar77 = vcmpps_avx(auVar77,auVar109,1);
          auVar155 = vblendvps_avx(auVar156,auVar155,auVar77);
          auVar65._0_4_ = fVar232 * fVar105;
          auVar65._4_4_ = fVar236 * fVar72;
          auVar65._8_4_ = fVar239 * fVar123;
          auVar65._12_4_ = fVar241 * fVar70;
          auVar89._0_4_ = fVar232 * fVar181;
          auVar89._4_4_ = fVar236 * fVar187;
          auVar89._8_4_ = fVar239 * fVar189;
          auVar89._12_4_ = fVar241 * fVar191;
          auVar134._0_4_ = fVar75 * fVar218;
          auVar134._4_4_ = fVar99 * fVar219;
          auVar134._8_4_ = fVar33 * fVar220;
          auVar134._12_4_ = fVar49 * fVar221;
          auVar156 = vsubps_avx(auVar89,auVar134);
          auVar151._0_4_ = fVar218 * fVar103;
          auVar151._4_4_ = fVar219 * fVar121;
          auVar151._8_4_ = fVar220 * fVar122;
          auVar151._12_4_ = fVar221 * fVar124;
          auVar157 = vsubps_avx(auVar151,auVar65);
          auVar77 = vandps_avx(auVar205,auVar134);
          auVar109 = vandps_avx(auVar205,auVar65);
          auVar77 = vcmpps_avx(auVar77,auVar109,1);
          auVar156 = vblendvps_avx(auVar157,auVar156,auVar77);
          auVar66._0_4_ = fVar103 * fVar101;
          auVar66._4_4_ = fVar121 * fVar102;
          auVar66._8_4_ = fVar122 * fVar104;
          auVar66._12_4_ = fVar124 * fVar139;
          auVar90._0_4_ = fVar75 * fVar101;
          auVar90._4_4_ = fVar99 * fVar102;
          auVar90._8_4_ = fVar33 * fVar104;
          auVar90._12_4_ = fVar49 * fVar139;
          auVar114._0_4_ = fVar232 * fVar188;
          auVar114._4_4_ = fVar236 * fVar190;
          auVar114._8_4_ = fVar239 * fVar192;
          auVar114._12_4_ = fVar241 * fVar212;
          auVar43._0_4_ = fVar232 * fVar224;
          auVar43._4_4_ = fVar236 * fVar225;
          auVar43._8_4_ = fVar239 * fVar226;
          auVar43._12_4_ = fVar241 * fVar227;
          auVar157 = vsubps_avx(auVar90,auVar114);
          auVar110 = vsubps_avx(auVar43,auVar66);
          auVar77 = vandps_avx(auVar205,auVar114);
          auVar109 = vandps_avx(auVar205,auVar66);
          auVar77 = vcmpps_avx(auVar77,auVar109,1);
          auVar157 = vblendvps_avx(auVar110,auVar157,auVar77);
          local_1a78._0_4_ = auVar17._0_4_;
          local_1a78._4_4_ = auVar17._4_4_;
          fStack_1a70 = auVar17._8_4_;
          local_1968 = auVar18._0_4_;
          fStack_1964 = auVar18._4_4_;
          fStack_1960 = auVar18._8_4_;
          fVar181 = auVar155._0_4_ * local_1968 +
                    auVar157._0_4_ * (float)local_1a78._0_4_ + local_1a48 * auVar156._0_4_;
          fVar105 = auVar155._4_4_ * fStack_1964 +
                    auVar157._4_4_ * (float)local_1a78._4_4_ + fStack_1a44 * auVar156._4_4_;
          fVar187 = auVar155._8_4_ * fStack_1960 +
                    auVar157._8_4_ * fStack_1a70 + fStack_1a40 * auVar156._8_4_;
          fVar72 = auVar155._12_4_ * fVar200 + auVar157._12_4_ * fVar180 + fVar201 * auVar156._12_4_
          ;
          auVar67._0_4_ = fVar181 + fVar181;
          auVar67._4_4_ = fVar105 + fVar105;
          auVar67._8_4_ = fVar187 + fVar187;
          auVar67._12_4_ = fVar72 + fVar72;
          fVar181 = auVar155._0_4_ * fVar152 + auVar157._0_4_ * fVar231 + auVar156._0_4_ * fVar166;
          fVar105 = auVar155._4_4_ * fVar153 + auVar157._4_4_ * fVar233 + auVar156._4_4_ * fVar176;
          fVar187 = auVar155._8_4_ * fVar154 + auVar157._8_4_ * fVar237 + auVar156._8_4_ * fVar177;
          fVar72 = auVar155._12_4_ * fVar182 + auVar157._12_4_ * fVar240 + auVar156._12_4_ * fVar8;
          auVar77 = vrcpps_avx(auVar67);
          fVar166 = auVar77._0_4_;
          auVar115._0_4_ = auVar67._0_4_ * fVar166;
          fVar176 = auVar77._4_4_;
          auVar115._4_4_ = auVar67._4_4_ * fVar176;
          fVar177 = auVar77._8_4_;
          auVar115._8_4_ = auVar67._8_4_ * fVar177;
          fVar8 = auVar77._12_4_;
          auVar115._12_4_ = auVar67._12_4_ * fVar8;
          auVar135._8_4_ = 0x3f800000;
          auVar135._0_8_ = &DAT_3f8000003f800000;
          auVar135._12_4_ = 0x3f800000;
          auVar77 = vsubps_avx(auVar135,auVar115);
          auVar44._0_4_ = (fVar181 + fVar181) * (fVar166 + fVar166 * auVar77._0_4_);
          auVar44._4_4_ = (fVar105 + fVar105) * (fVar176 + fVar176 * auVar77._4_4_);
          auVar44._8_4_ = (fVar187 + fVar187) * (fVar177 + fVar177 * auVar77._8_4_);
          auVar44._12_4_ = (fVar72 + fVar72) * (fVar8 + fVar8 * auVar77._12_4_);
          auVar77 = *(undefined1 (*) [16])(ray + 0x80);
          auVar109 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar44,2);
          auVar110 = vcmpps_avx(auVar44,auVar77,2);
          auVar109 = vandps_avx(auVar109,auVar110);
          auVar199 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar110 = vcmpps_avx(ZEXT816(0) << 0x20,auVar67,4);
          auVar109 = vandps_avx(auVar110,auVar109);
          auVar96 = vandps_avx(auVar45,auVar96);
          auVar109 = vpslld_avx(auVar109,0x1f);
          auVar110 = vpsrad_avx(auVar109,0x1f);
          auVar109 = auVar96 & auVar110;
          auVar206 = ZEXT1664(auVar45);
          if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar109 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar109 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar109[0xf]) {
            auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          }
          else {
            auVar96 = vandps_avx(auVar110,auVar96);
            uVar3 = *(uint *)(lVar25 + -0x10 + uVar24 * 4);
            pGVar6 = (context->scene->geometries).items[uVar3].ptr;
            uVar21 = pGVar6->mask;
            auVar91._4_4_ = uVar21;
            auVar91._0_4_ = uVar21;
            auVar91._8_4_ = uVar21;
            auVar91._12_4_ = uVar21;
            auVar109 = vandps_avx(auVar91,*(undefined1 (*) [16])(ray + 0x90));
            auVar109 = vpcmpeqd_avx(ZEXT816(0) << 0x20,auVar109);
            auVar110 = auVar96 & ~auVar109;
            auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar110[0xf] < '\0') {
              auVar96 = vandnps_avx(auVar109,auVar96);
              auVar69 = ZEXT1664(auVar96);
              auVar74 = (undefined1  [48])0x0;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar109 = vrcpps_avx(auVar131);
                fVar166 = auVar109._0_4_;
                auVar118._0_4_ = auVar131._0_4_ * fVar166;
                fVar176 = auVar109._4_4_;
                auVar118._4_4_ = auVar131._4_4_ * fVar176;
                fVar177 = auVar109._8_4_;
                auVar118._8_4_ = auVar131._8_4_ * fVar177;
                fVar8 = auVar109._12_4_;
                auVar118._12_4_ = auVar131._12_4_ * fVar8;
                auVar165._8_4_ = 0x3f800000;
                auVar165._0_8_ = &DAT_3f8000003f800000;
                auVar165._12_4_ = 0x3f800000;
                auVar109 = vsubps_avx(auVar165,auVar118);
                auVar93._0_4_ = fVar166 + fVar166 * auVar109._0_4_;
                auVar93._4_4_ = fVar176 + fVar176 * auVar109._4_4_;
                auVar93._8_4_ = fVar177 + fVar177 * auVar109._8_4_;
                auVar93._12_4_ = fVar8 + fVar8 * auVar109._12_4_;
                auVar119._8_4_ = 0x219392ef;
                auVar119._0_8_ = 0x219392ef219392ef;
                auVar119._12_4_ = 0x219392ef;
                auVar46 = vcmpps_avx(auVar46,auVar119,5);
                auVar46 = vandps_avx(auVar46,auVar93);
                auVar120._0_4_ = auVar46._0_4_ * auVar216._0_4_;
                auVar120._4_4_ = auVar46._4_4_ * auVar216._4_4_;
                auVar120._8_4_ = auVar46._8_4_ * auVar216._8_4_;
                auVar120._12_4_ = auVar46._12_4_ * auVar216._12_4_;
                auVar109 = vminps_avx(auVar120,auVar165);
                auVar94._0_4_ = auVar46._0_4_ * auVar198._0_4_;
                auVar94._4_4_ = auVar46._4_4_ * auVar198._4_4_;
                auVar94._8_4_ = auVar46._8_4_ * auVar198._8_4_;
                auVar94._12_4_ = auVar46._12_4_ * auVar198._12_4_;
                auVar46 = vminps_avx(auVar94,auVar165);
                auVar110 = vsubps_avx(auVar165,auVar109);
                auVar193 = vsubps_avx(auVar165,auVar46);
                local_18c8 = vblendvps_avx(auVar109,auVar110,auVar9);
                local_18b8 = vblendvps_avx(auVar46,auVar193,auVar9);
                local_1898 = vpshufd_avx(ZEXT416(uVar3),0);
                local_18a8 = vpshufd_avx(ZEXT416(*(uint *)(lVar25 + uVar24 * 4)),0);
                vcmpps_avx(ZEXT1632(local_18b8),ZEXT1632(local_18b8),0xf);
                uStack_1884 = context->user->instID[0];
                local_1888 = uStack_1884;
                uStack_1880 = uStack_1884;
                uStack_187c = uStack_1884;
                uStack_1878 = context->user->instPrimID[0];
                uStack_1874 = uStack_1878;
                uStack_1870 = uStack_1878;
                uStack_186c = uStack_1878;
                auVar46 = vblendvps_avx(auVar77,auVar44,auVar96);
                *(undefined1 (*) [16])(ray + 0x80) = auVar46;
                args.valid = (int *)local_1a28;
                args.geometryUserPtr = pGVar6->userPtr;
                args.context = context->user;
                args.hit = local_18f8;
                args.N = 4;
                local_1a28 = auVar96;
                args.ray = (RTCRayN *)ray;
                local_18f8 = (RTCHitN  [16])auVar155;
                local_18e8 = auVar156;
                local_18d8 = auVar157;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&args);
                  auVar199 = ZEXT816(0) << 0x40;
                  auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar74 = extraout_var;
                }
                if (local_1a28 == (undefined1  [16])0x0) {
                  auVar46 = vpcmpeqd_avx(auVar199,(undefined1  [16])0x0);
                  auVar46 = auVar46 ^ _DAT_01febe20;
                }
                else {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var7)(&args);
                    auVar199 = ZEXT816(0) << 0x40;
                    auVar230 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                 ));
                    auVar223 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                 ));
                    auVar217 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                  }
                  auVar96 = vpcmpeqd_avx(auVar199,local_1a28);
                  auVar46 = auVar96 ^ _DAT_01febe20;
                  auVar95._8_4_ = 0xff800000;
                  auVar95._0_8_ = 0xff800000ff800000;
                  auVar95._12_4_ = 0xff800000;
                  auVar96 = vblendvps_avx(auVar95,*(undefined1 (*) [16])(args.ray + 0x80),auVar96);
                  auVar74 = (undefined1  [48])0x0;
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar96;
                }
                auVar46 = vpslld_avx(auVar46,0x1f);
                auVar69._0_16_ = vpsrad_avx(auVar46,0x1f);
                auVar69._16_48_ = auVar74;
                auVar46 = vblendvps_avx(auVar77,*(undefined1 (*) [16])pRVar1,auVar46);
                *(undefined1 (*) [16])pRVar1 = auVar46;
              }
              auVar235 = ZEXT1664(local_1a18);
              auVar45 = vpandn_avx(auVar69._0_16_,auVar45);
              auVar206 = ZEXT1664(auVar45);
              goto LAB_003272a4;
            }
          }
          auVar69 = ZEXT1664(auVar96);
          auVar235 = ZEXT1664(local_1a18);
        }
LAB_003272a4:
        auVar45 = auVar206._0_16_;
        bVar32 = (((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 auVar206[0xf] < '\0';
      }
      auVar46 = auVar206._0_16_;
      auVar45 = auVar235._0_16_;
      if ((!bVar32) || (bVar32 = 2 < uVar24, uVar24 = uVar24 + 1, bVar32)) break;
    }
    auVar77 = vandps_avx(auVar46,auVar45);
    auVar45 = auVar45 & auVar46;
    if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar45 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar45[0xf])
    break;
  }
  auVar45 = vpcmpeqd_avx(auVar69._0_16_,auVar69._0_16_);
  aVar47._0_4_ = auVar77._0_4_ ^ auVar45._0_4_;
  aVar47._4_4_ = auVar77._4_4_ ^ auVar45._4_4_;
  aVar47._8_4_ = auVar77._8_4_ ^ auVar45._8_4_;
  aVar47._12_4_ = auVar77._12_4_ ^ auVar45._12_4_;
LAB_0032791f:
  auVar69 = ZEXT1664(auVar45);
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])aVar47,(undefined1  [16])terminated.field_0);
  auVar45 = auVar45 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar45 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar45[0xf]) {
LAB_0032795d:
    iVar22 = 3;
  }
  else {
    auVar69 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
    auVar97._8_4_ = 0xff800000;
    auVar97._0_8_ = 0xff800000ff800000;
    auVar97._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar97,
                       (undefined1  [16])terminated.field_0);
    iVar22 = 0;
  }
LAB_00327960:
  if (iVar22 == 3) {
    auVar9 = vandps_avx(auVar68,(undefined1  [16])terminated.field_0);
    auVar68._8_4_ = 0xff800000;
    auVar68._0_8_ = 0xff800000ff800000;
    auVar68._12_4_ = 0xff800000;
    auVar9 = vmaskmovps_avx(auVar9,auVar68);
    *(undefined1 (*) [16])pRVar1 = auVar9;
    return;
  }
  goto LAB_003266b5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }